

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageChannel.cpp
# Opt level: O0

DeepSlice * __thiscall
Imf_3_2::TypedDeepImageChannel<Imath_3_2::half>::slice(TypedDeepImageChannel<Imath_3_2::half> *this)

{
  ImageLevel *pIVar1;
  PixelType PVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ImageChannel *in_RSI;
  DeepSlice *in_RDI;
  
  PVar2 = (**in_RSI->_vptr_ImageChannel)();
  pIVar1 = in_RSI[1]._level;
  iVar3 = ImageChannel::pixelsPerRow(in_RSI);
  iVar4 = ImageChannel::xSampling(in_RSI);
  iVar5 = ImageChannel::ySampling(in_RSI);
  Imf_3_2::DeepSlice::DeepSlice
            (in_RDI,PVar2,(char *)pIVar1,8,(long)iVar3 << 3,2,iVar4,iVar5,0.0,false,false);
  return in_RDI;
}

Assistant:

DeepSlice
TypedDeepImageChannel<T>::slice () const
{
    return DeepSlice (
        pixelType (),                  // type
        (char*) _base,                 // base
        sizeof (T*),                   // xStride
        pixelsPerRow () * sizeof (T*), // yStride
        sizeof (T),                    // sampleStride
        xSampling (),
        ySampling ());
}